

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall QComboBox::setLineEdit(QComboBox *this,QLineEdit *edit)

{
  QComboBoxPrivate *this_00;
  void **ppvVar1;
  QLineEdit *pQVar2;
  void **ppvVar3;
  QWidgetPrivate *pQVar4;
  undefined4 *puVar5;
  QCompleter *pQVar6;
  QWidget *this_01;
  long in_FS_OFFSET;
  QObject local_98 [8];
  Connection local_90;
  Connection local_88;
  Connection local_80;
  QObject local_78 [8];
  Connection local_70;
  QObject local_68 [8];
  QString local_60;
  code *local_48;
  ImplFn local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (edit == (QLineEdit *)0x0) {
    setLineEdit();
  }
  else {
    this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
    if (this_00->lineEdit != edit) {
      currentText(&local_60,this);
      QLineEdit::setText(edit,&local_60);
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (this_00->lineEdit != (QLineEdit *)0x0) {
        (**(code **)(*(long *)&this_00->lineEdit->super_QWidget + 0x20))();
      }
      this_00->lineEdit = edit;
      pQVar4 = qt_widget_private(&edit->super_QWidget);
      pQVar4->field_0x253 = pQVar4->field_0x253 | 4;
      this_01 = &this_00->lineEdit->super_QWidget;
      if (*(QComboBox **)(*(long *)&this_01->field_0x8 + 0x10) != this) {
        QWidget::setParent(this_01,&this->super_QWidget);
        this_01 = &this_00->lineEdit->super_QWidget;
      }
      local_60.d.d = (Data *)QLineEdit::returnPressed;
      local_60.d.ptr = (char16_t *)0x0;
      local_48 = QComboBoxPrivate::returnPressed;
      local_40 = (ImplFn)0x0;
      ppvVar1 = *(void ***)&(this_00->super_QWidgetPrivate).field_0x8;
      puVar5 = (undefined4 *)operator_new(0x20);
      *puVar5 = 1;
      *(code **)(puVar5 + 2) =
           QtPrivate::QPrivateSlotObject<void_(QComboBoxPrivate::*)(),_QtPrivate::List<>,_void>::
           impl;
      *(code **)(puVar5 + 4) = QComboBoxPrivate::returnPressed;
      *(undefined8 *)(puVar5 + 6) = 0;
      QObject::connectImpl
                (local_68,(void **)this_01,(QObject *)&local_60,ppvVar1,(QSlotObjectBase *)&local_48
                 ,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_68);
      pQVar2 = this_00->lineEdit;
      local_60.d.d = (Data *)QLineEdit::editingFinished;
      local_60.d.ptr = (char16_t *)0x0;
      local_48 = QComboBoxPrivate::editingFinished;
      local_40 = (ImplFn)0x0;
      ppvVar1 = *(void ***)&(this_00->super_QWidgetPrivate).field_0x8;
      puVar5 = (undefined4 *)operator_new(0x20);
      *puVar5 = 1;
      *(code **)(puVar5 + 2) =
           QtPrivate::QPrivateSlotObject<void_(QComboBoxPrivate::*)(),_QtPrivate::List<>,_void>::
           impl;
      *(code **)(puVar5 + 4) = QComboBoxPrivate::editingFinished;
      *(undefined8 *)(puVar5 + 6) = 0;
      QObject::connectImpl
                ((QObject *)&local_70,(void **)pQVar2,(QObject *)&local_60,ppvVar1,
                 (QSlotObjectBase *)&local_48,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection(&local_70);
      pQVar2 = this_00->lineEdit;
      local_48 = editTextChanged;
      local_40 = (ImplFn)0x0;
      local_60.d.d = (Data *)QLineEdit::textChanged;
      local_60.d.ptr = (char16_t *)0x0;
      puVar5 = (undefined4 *)operator_new(0x20);
      *puVar5 = 1;
      *(code **)(puVar5 + 2) =
           QtPrivate::
           QCallableObject<void_(QComboBox::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
           ::impl;
      *(code **)(puVar5 + 4) = editTextChanged;
      *(undefined8 *)(puVar5 + 6) = 0;
      QObject::connectImpl
                (local_78,(void **)pQVar2,(QObject *)&local_60,(void **)this,
                 (QSlotObjectBase *)&local_48,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_78);
      pQVar2 = this_00->lineEdit;
      local_48 = currentTextChanged;
      local_40 = (ImplFn)0x0;
      local_60.d.d = (Data *)QLineEdit::textChanged;
      local_60.d.ptr = (char16_t *)0x0;
      puVar5 = (undefined4 *)operator_new(0x20);
      *puVar5 = 1;
      *(code **)(puVar5 + 2) =
           QtPrivate::
           QCallableObject<void_(QComboBox::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
           ::impl;
      *(code **)(puVar5 + 4) = currentTextChanged;
      *(undefined8 *)(puVar5 + 6) = 0;
      QObject::connectImpl
                ((QObject *)&local_80,(void **)pQVar2,(QObject *)&local_60,(void **)this,
                 (QSlotObjectBase *)&local_48,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection(&local_80);
      pQVar2 = this_00->lineEdit;
      local_60.d.d = (Data *)QLineEdit::cursorPositionChanged;
      local_60.d.ptr = (char16_t *)0x0;
      local_48 = QComboBoxPrivate::updateMicroFocus;
      local_40 = (ImplFn)0x0;
      ppvVar1 = *(void ***)&(this_00->super_QWidgetPrivate).field_0x8;
      puVar5 = (undefined4 *)operator_new(0x20);
      *puVar5 = 1;
      *(code **)(puVar5 + 2) =
           QtPrivate::QPrivateSlotObject<void_(QComboBoxPrivate::*)(),_QtPrivate::List<>,_void>::
           impl;
      *(code **)(puVar5 + 4) = QComboBoxPrivate::updateMicroFocus;
      *(undefined8 *)(puVar5 + 6) = 0;
      QObject::connectImpl
                ((QObject *)&local_88,(void **)pQVar2,(QObject *)&local_60,ppvVar1,
                 (QSlotObjectBase *)&local_48,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection(&local_88);
      pQVar2 = this_00->lineEdit;
      local_60.d.d = (Data *)QLineEdit::selectionChanged;
      local_60.d.ptr = (char16_t *)0x0;
      local_48 = QComboBoxPrivate::updateMicroFocus;
      local_40 = (ImplFn)0x0;
      ppvVar1 = *(void ***)&(this_00->super_QWidgetPrivate).field_0x8;
      puVar5 = (undefined4 *)operator_new(0x20);
      *puVar5 = 1;
      *(code **)(puVar5 + 2) =
           QtPrivate::QPrivateSlotObject<void_(QComboBoxPrivate::*)(),_QtPrivate::List<>,_void>::
           impl;
      *(code **)(puVar5 + 4) = QComboBoxPrivate::updateMicroFocus;
      *(undefined8 *)(puVar5 + 6) = 0;
      QObject::connectImpl
                ((QObject *)&local_90,(void **)pQVar2,(QObject *)&local_60,ppvVar1,
                 (QSlotObjectBase *)&local_48,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection(&local_90);
      ppvVar1 = *(void ***)(*(long *)&(this_00->lineEdit->super_QWidget).field_0x8 + 600);
      local_60.d.d = (Data *)QWidgetLineControl::updateMicroFocus;
      local_60.d.ptr = (char16_t *)0x0;
      local_48 = QComboBoxPrivate::updateMicroFocus;
      local_40 = (ImplFn)0x0;
      ppvVar3 = *(void ***)&(this_00->super_QWidgetPrivate).field_0x8;
      puVar5 = (undefined4 *)operator_new(0x20);
      *puVar5 = 1;
      *(code **)(puVar5 + 2) =
           QtPrivate::QPrivateSlotObject<void_(QComboBoxPrivate::*)(),_QtPrivate::List<>,_void>::
           impl;
      *(code **)(puVar5 + 4) = QComboBoxPrivate::updateMicroFocus;
      *(undefined8 *)(puVar5 + 6) = 0;
      QObject::connectImpl
                (local_98,ppvVar1,(QObject *)&local_60,ppvVar3,(QSlotObjectBase *)&local_48,
                 (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_98);
      QLineEdit::setFrame(this_00->lineEdit,false);
      QWidget::setContextMenuPolicy(&this_00->lineEdit->super_QWidget,NoContextMenu);
      QWidget::setFocusProxy(&this_00->lineEdit->super_QWidget,&this->super_QWidget);
      QWidget::setAttribute(&this_00->lineEdit->super_QWidget,WA_MacShowFocusRect,false);
      pQVar6 = QLineEdit::completer(this_00->lineEdit);
      if (pQVar6 == (QCompleter *)0x0) {
        pQVar6 = (QCompleter *)operator_new(0x10);
        QCompleter::QCompleter(pQVar6,this_00->model,(QObject *)this_00->lineEdit);
        QCompleter::setCaseSensitivity(pQVar6,CaseInsensitive);
        QCompleter::setCompletionMode(pQVar6,InlineCompletion);
        QCompleter::setCompletionColumn(pQVar6,this_00->modelColumn);
        setCompleter(this,pQVar6);
      }
      QWidget::setAttribute(&this->super_QWidget,WA_InputMethodEnabled,true);
      QComboBoxPrivate::updateLayoutDirection(this_00);
      QComboBoxPrivate::updateLineEditGeometry(this_00);
      if ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
        QWidget::show(&this_00->lineEdit->super_QWidget);
      }
      QWidget::update(&this->super_QWidget);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::setLineEdit(QLineEdit *edit)
{
    Q_D(QComboBox);
    if (Q_UNLIKELY(!edit)) {
        qWarning("QComboBox::setLineEdit: cannot set a 0 line edit");
        return;
    }

    if (edit == d->lineEdit)
        return;

    edit->setText(currentText());
    delete d->lineEdit;

    d->lineEdit = edit;
#ifndef QT_NO_IM
    qt_widget_private(d->lineEdit)->inheritsInputMethodHints = 1;
#endif
    if (d->lineEdit->parent() != this)
        d->lineEdit->setParent(this);
    QObjectPrivate::connect(d->lineEdit, &QLineEdit::returnPressed,
                            d, &QComboBoxPrivate::returnPressed);
    QObjectPrivate::connect(d->lineEdit, &QLineEdit::editingFinished,
                            d, &QComboBoxPrivate::editingFinished);
    connect(d->lineEdit, &QLineEdit::textChanged, this, &QComboBox::editTextChanged);
    connect(d->lineEdit, &QLineEdit::textChanged, this, &QComboBox::currentTextChanged);
    QObjectPrivate::connect(d->lineEdit, &QLineEdit::cursorPositionChanged,
                            d, &QComboBoxPrivate::updateMicroFocus);
    QObjectPrivate::connect(d->lineEdit, &QLineEdit::selectionChanged,
                            d, &QComboBoxPrivate::updateMicroFocus);
    QObjectPrivate::connect(d->lineEdit->d_func()->control, &QWidgetLineControl::updateMicroFocus,
                            d, &QComboBoxPrivate::updateMicroFocus);
    d->lineEdit->setFrame(false);
    d->lineEdit->setContextMenuPolicy(Qt::NoContextMenu);
    d->updateFocusPolicy();
    d->lineEdit->setFocusProxy(this);
    d->lineEdit->setAttribute(Qt::WA_MacShowFocusRect, false);

#if QT_CONFIG(completer)
    // create a default completer
    if (!d->lineEdit->completer()) {
        QCompleter *completer = new QCompleter(d->model, d->lineEdit);
        completer->setCaseSensitivity(Qt::CaseInsensitive);
        completer->setCompletionMode(QCompleter::InlineCompletion);
        completer->setCompletionColumn(d->modelColumn);

#ifdef QT_KEYPAD_NAVIGATION
        // Editable combo boxes will have a completer that is set to UnfilteredPopupCompletion.
        // This means that when the user enters edit mode they are immediately presented with a
        // list of possible completions.
        if (QApplicationPrivate::keypadNavigationEnabled())
            completer->setCompletionMode(QCompleter::UnfilteredPopupCompletion);
#endif
        // sets up connections
        setCompleter(completer);
    }
#endif

    setAttribute(Qt::WA_InputMethodEnabled);
    d->updateLayoutDirection();
    d->updateLineEditGeometry();
    if (isVisible())
        d->lineEdit->show();

    update();
}